

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O0

DynamicStaleResourceWrapper __thiscall
Diligent::DynamicStaleResourceWrapper::
Create<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
          (DynamicStaleResourceWrapper *this,
          RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Resource,
          RefCounterType NumReferences)

{
  Char *Message;
  char (*in_RCX) [19];
  StaleResourceBase *local_98;
  undefined1 local_40 [8];
  string msg;
  RefCounterType NumReferences_local;
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Resource_local;
  
  msg.field_2._8_8_ = NumReferences;
  if (NumReferences < 1) {
    FormatString<char[26],char[19]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumReferences >= 1",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0x48);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (msg.field_2._8_8_ == 1) {
    local_98 = (StaleResourceBase *)::operator_new(0x28);
    Create<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::
    VkSemaphoreType>,void>(VulkanUtilities::VulkanSyncObjectManager::
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>&&,long)::SpecificStaleResource::
    SpecificStaleResource(VulkanUtilities::VulkanSyncObjectManager::
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>___(local_98,Resource);
  }
  else {
    local_98 = (StaleResourceBase *)::operator_new(0x30);
    Create<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::
    VkSemaphoreType>,void>(VulkanUtilities::VulkanSyncObjectManager::
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>&&,long)::SpecificSharedStaleResource::
    SpecificSharedStaleResource(VulkanUtilities::VulkanSyncObjectManager::
    RecycledSyncObject<VulkanUtilities::VkSemaphoreType>___long_
              (local_98,Resource,msg.field_2._8_8_);
  }
  DynamicStaleResourceWrapper(this,local_98);
  return (DynamicStaleResourceWrapper)(StaleResourceBase *)this;
}

Assistant:

static DynamicStaleResourceWrapper Create(ResourceType&& Resource, RefCounterType NumReferences)
    {
        VERIFY_EXPR(NumReferences >= 1);

        class SpecificStaleResource final : public StaleResourceBase
        {
        public:
            SpecificStaleResource(ResourceType&& SpecificResource) :
                m_SpecificResource(std::move(SpecificResource))
            {}

            // clang-format off
            SpecificStaleResource             (const SpecificStaleResource&) = delete;
            SpecificStaleResource             (SpecificStaleResource&&)      = delete;
            SpecificStaleResource& operator = (const SpecificStaleResource&) = delete;
            SpecificStaleResource& operator = (SpecificStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                delete this;
            }

        private:
            ResourceType m_SpecificResource;
        };

        class SpecificSharedStaleResource final : public StaleResourceBase
        {
        public:
            SpecificSharedStaleResource(ResourceType&& SpecificResource, RefCounterType NumReferences) :
                m_SpecificResource(std::move(SpecificResource)),
                m_RefCounter{NumReferences}
            {
            }

            // clang-format off
            SpecificSharedStaleResource             (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource             (SpecificSharedStaleResource&&)      = delete;
            SpecificSharedStaleResource& operator = (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource& operator = (SpecificSharedStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                if (m_RefCounter.fetch_add(-1) - 1 == 0)
                {
                    delete this;
                }
            }

        private:
            ResourceType                m_SpecificResource;
            std::atomic<RefCounterType> m_RefCounter;
        };

        return DynamicStaleResourceWrapper{
            NumReferences == 1 ?
                static_cast<StaleResourceBase*>(new SpecificStaleResource{std::move(Resource)}) :
                static_cast<StaleResourceBase*>(new SpecificSharedStaleResource{std::move(Resource), NumReferences})};
    }